

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O2

int main(void)

{
  pointer *this;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  reference this_00;
  long lVar5;
  size_type __n;
  pointer paVar6;
  addrinfo local_208;
  char local_1d8 [8];
  char s [46];
  undefined1 local_1a0 [8];
  sockaddr_storage their_addr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  msgs;
  queue<int,_std::deque<int,_std::allocator<int>_>_> ordering;
  vector<cUser,_std::allocator<cUser>_> currUsers;
  addrinfo *servinfo;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  reference_wrapper<bool[10]> local_78;
  reference_wrapper<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  reference_wrapper<std::vector<cUser,_std::allocator<cUser>_>_> local_68;
  bool local_5e [8];
  bool msgFlags [10];
  socklen_t sin_size;
  int yes;
  bool finished [10];
  int new_fd;
  int nextIndex;
  
  msgFlags[6] = true;
  msgFlags[7] = false;
  msgFlags[8] = false;
  msgFlags[9] = false;
  ordering.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)0x0;
  currUsers.super__Vector_base<cUser,_std::allocator<cUser>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  currUsers.super__Vector_base<cUser,_std::allocator<cUser>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&their_addr.__ss_align,10,
           (allocator_type *)
           &msgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&servinfo,10,
             (allocator_type *)
             &msgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &msgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (new_fd = 0; new_fd < 10; new_fd = new_fd + 1) {
    std::deque<int,_std::allocator<int>_>::push_back
              ((deque<int,_std::allocator<int>_> *)
               &msgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&new_fd);
    *(undefined1 *)((long)&sin_size + (long)new_fd + 2) = 0;
    local_5e[new_fd] = false;
  }
  local_208.ai_addrlen = 0;
  local_208._20_4_ = 0;
  local_208.ai_addr = (sockaddr *)0x0;
  local_208.ai_canonname = (char *)0x0;
  local_208.ai_next = (addrinfo *)0x0;
  local_208.ai_socktype = 1;
  local_208.ai_protocol = 0;
  local_208.ai_flags = 1;
  local_208.ai_family = 0;
  paVar6 = (pointer)&currUsers.super__Vector_base<cUser,_std::allocator<cUser>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
  iVar1 = getaddrinfo((char *)0x0,"3491",&local_208,(addrinfo **)paVar6);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"getaddrinfo: ");
    pcVar4 = gai_strerror(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              ((_Deque_base<int,_std::allocator<int>_> *)
               &msgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)&servinfo);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&their_addr.__ss_align);
    std::vector<cUser,_std::allocator<cUser>_>::~vector
              ((vector<cUser,_std::allocator<cUser>_> *)
               &ordering.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node);
    return 1;
  }
  iVar1 = 0;
  for (; paVar6 = *(pointer *)&paVar6->username, paVar6 != (pointer)0x0; paVar6 = paVar6 + 1) {
    iVar1 = socket(*(int *)((long)&(paVar6->username)._M_dataplus + 4),
                   (int)(paVar6->username)._M_string_length,
                   *(int *)((long)&(paVar6->username)._M_string_length + 4));
    pcVar4 = "server: socket";
    if (iVar1 != -1) {
      iVar2 = setsockopt(iVar1,1,2,msgFlags + 6,4);
      if (iVar2 == -1) {
        pcVar4 = "setsockopt";
        goto LAB_00105731;
      }
      iVar2 = bind(iVar1,*(sockaddr **)((long)&(paVar6->username).field_2 + 8),
                   *(socklen_t *)&(paVar6->username).field_2);
      if (iVar2 != -1) break;
      close(iVar1);
      pcVar4 = "server: bind";
    }
    perror(pcVar4);
  }
  freeaddrinfo((addrinfo *)
               currUsers.super__Vector_base<cUser,_std::allocator<cUser>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  if (paVar6 == (pointer)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"server: failed to bind");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    iVar2 = listen(iVar1,5);
    if (iVar2 != -1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"My chat room server. Version Two.");
      std::endl<char,std::char_traits<char>>(poVar3);
      this = &msgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        while (ordering.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node ==
               (_Map_pointer)
               ordering.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_map_size) {
          for (new_fd = 0; new_fd < 10; new_fd = new_fd + 1) {
            __n = (size_type)new_fd;
            if (*(char *)((long)&sin_size + __n + 2) == '\x01') {
              *(undefined1 *)((long)&sin_size + __n + 2) = 0;
              local_5e[__n] = false;
              std::vector<std::thread,_std::allocator<std::thread>_>::at
                        ((vector<std::thread,_std::allocator<std::thread>_> *)&servinfo,__n);
              std::thread::join();
              std::deque<int,_std::allocator<int>_>::push_back
                        ((deque<int,_std::allocator<int>_> *)this,(value_type_conflict *)&new_fd);
            }
          }
        }
        msgFlags[2] = true;
        msgFlags[3] = false;
        msgFlags[4] = false;
        msgFlags[5] = false;
        finished[2] = false;
        finished[3] = false;
        finished[4] = false;
        finished[5] = false;
        iVar2 = accept(iVar1,(sockaddr *)local_1a0,(socklen_t *)(msgFlags + 2));
        finished[2] = (bool)(char)iVar2;
        finished[3] = (bool)(char)((uint)iVar2 >> 8);
        finished[4] = (bool)(char)((uint)iVar2 >> 0x10);
        finished[5] = (bool)(char)((uint)iVar2 >> 0x18);
        if (iVar2 != 0) {
          if (iVar2 == -1) {
            perror("accept");
          }
          inet_ntop((uint)(ushort)local_1a0._0_2_,
                    local_1a0 + (ulong)((ushort)local_1a0._0_2_ != 2) * 4 + 4,local_1d8,0x2e);
          finished._6_4_ =
               *(undefined4 *)
                ordering.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_map_size;
          std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)this)
          ;
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)((long)&sin_size + 2);
          local_78._M_data = (bool (*) [10])local_5e;
          local_68._M_data =
               (vector<cUser,_std::allocator<cUser>_> *)
               &ordering.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
          local_70._M_data =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&their_addr.__ss_align;
          std::thread::
          thread<void(&)(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&),int&,int&,std::reference_wrapper<bool[10]>,std::reference_wrapper<bool[10]>,std::reference_wrapper<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::reference_wrapper<std::vector<cUser,std::allocator<cUser>>>,void>
                    ((thread *)&new_fd,threadFunc,(int *)(finished + 6),(int *)(finished + 2),
                     (reference_wrapper<bool[10]> *)
                     &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_78,&local_70,&local_68);
          this_00 = std::vector<std::thread,_std::allocator<std::thread>_>::at
                              ((vector<std::thread,_std::allocator<std::thread>_> *)&servinfo,
                               (long)(int)finished._6_4_);
          std::thread::operator=(this_00,(thread *)&new_fd);
          std::thread::~thread((thread *)&new_fd);
          for (new_fd = 0; new_fd < 10; new_fd = new_fd + 1) {
            if (*(char *)((long)&sin_size + (long)new_fd + 2U) == '\x01') {
              std::vector<std::thread,_std::allocator<std::thread>_>::at
                        ((vector<std::thread,_std::allocator<std::thread>_> *)&servinfo,(long)new_fd
                        );
              std::thread::join();
              lVar5 = (long)new_fd;
              *(undefined1 *)((long)&sin_size + lVar5 + 2) = 0;
              local_5e[lVar5] = false;
              std::deque<int,_std::allocator<int>_>::push_back
                        ((deque<int,_std::allocator<int>_> *)this,(value_type_conflict *)&new_fd);
            }
          }
        }
      } while( true );
    }
    pcVar4 = "listen";
LAB_00105731:
    perror(pcVar4);
  }
  exit(1);
}

Assistant:

int main(){


    //the thousand of varibles needed to run these sockets
    int sockfd, new_fd, numbytes;  // listen on sock_fd, new connection on new_fd
    struct addrinfo hints, *servinfo, *p;
    struct sockaddr_storage their_addr; // connector's address information
    socklen_t sin_size;
    struct sigaction sa;
    int yes=1;
    char s[INET6_ADDRSTRLEN];
    int rv;



    //session based varibles to pass all the info around
    vector<cUser> currUsers;
    bool finished[MAX_NUM_THREADS];
    bool msgFlags[MAX_NUM_THREADS];
    vector<string> msgs(MAX_NUM_THREADS);
    vector<thread> threads(MAX_NUM_THREADS);
    queue<int> ordering;


    //initialize message queue and thread quit flags
    for(int i=0; i<MAX_NUM_THREADS; i++){
        ordering.push(i);
        finished[i] = false;
        msgFlags[i] = false;
    }

    //zero out the address space of the strucutre for safty
    memset(&hints, 0, sizeof hints);

    // like client this allows for IPV4 and IPV6
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;

    //use same ip address as return address
    hints.ai_flags = AI_PASSIVE;

    //get the info to create the socket
    if ((rv = getaddrinfo(NULL, PORT, &hints, &servinfo)) != 0) {
        cerr << "getaddrinfo: " <<  gai_strerror(rv) << endl;
        return 1;
    }

    // loop through all the results and bind to the first we can
    for(p = servinfo; p != NULL; p = p->ai_next) {

        if ((sockfd = socket(p->ai_family, p->ai_socktype,
                p->ai_protocol)) == -1) {
            perror("server: socket");
            continue;
        }

        if (setsockopt(sockfd, SOL_SOCKET, SO_REUSEADDR, &yes,
                sizeof(int)) == -1) {
            perror("setsockopt");
            exit(1);
        }

        //bind to the socket address
        if (bind(sockfd, p->ai_addr, p->ai_addrlen) == -1) {
            close(sockfd);
            perror("server: bind");
            continue;
        }

        break;
    }


    freeaddrinfo(servinfo); // all done with this structure

    //check if something went wrong
    if (p == NULL)  {
        cerr << "server: failed to bind" << endl;
        exit(1);
    }

    //start listening on the socket
    if (listen(sockfd, BACKLOG) == -1) {
        perror("listen");
        exit(1);
    }

    //init message
    cout << "My chat room server. Version Two." << endl;




    while(1){

        //if at max clients what to accept until a connection was closed
        //stops people over max number of connections from connecting
        while(ordering.empty()){
            for(int i=0; i<MAX_NUM_THREADS; i++){
                if(finished[i]){
                    finished[i] = false;
                    msgFlags[i] = false;
                    threads.at(i).join();
                    ordering.push(i);
                }
            }
        }

        //get the accepted connection
        sin_size = sizeof their_addr;
        new_fd = 0;
        new_fd = accept(sockfd, (struct sockaddr *)&their_addr, &sin_size);

        //check for errors
        if (new_fd == -1) {
            perror("accept");
        }
        else if(new_fd == 0){
            //cout << "testing";
            continue;
        }

        //turn the address from binary to family friendly G rated words
        //I don't use this here but I will definily later, this is really cool :)
        inet_ntop(their_addr.ss_family,
            get_in_addr((struct sockaddr *)&their_addr),
            s, sizeof s);


        //cout << "server: got connection from " <<  s << endl;

        //get the next threadid to spawn
        int nextIndex = ordering.front();
        ordering.pop();

        //spawn a thread for the new connection made
        threads.at(nextIndex) = thread(threadFunc,nextIndex,new_fd,
            ref(finished),ref(msgFlags),ref(msgs),ref(currUsers));


        //check if any clients have quite, reap the thread and free the index
        // make sure to set the flags back and add the index back to the queue
        for(int i=0; i<MAX_NUM_THREADS; i++){
            if(finished[i]){
                threads.at(i).join();
                finished[i] = false;
                msgFlags[i] = false;
                ordering.push(i);
            }
        }


    }

    //tity up everyting
    close(sockfd);

    return 0;
}